

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

pair<bool,_const_char_*> consistentProperty<char_const*>(char *lhs,char *rhs,CompatibleType t)

{
  pair<bool,_const_char_*> pVar1;
  char *null_ptr;
  char *pcStack_28;
  CompatibleType t_local;
  char *rhs_local;
  char *lhs_local;
  char *local_10;
  
  null_ptr._4_4_ = t;
  pcStack_28 = rhs;
  rhs_local = lhs;
  if ((lhs == (char *)0x0) && (rhs == (char *)0x0)) {
    null_ptr._3_1_ = 1;
    pVar1 = std::make_pair<bool,char_const*&>((bool *)((long)&null_ptr + 3),&rhs_local);
    lhs_local._0_1_ = pVar1.first;
  }
  else if (lhs == (char *)0x0) {
    null_ptr._2_1_ = 1;
    pVar1 = std::make_pair<bool,char_const*&>
                      ((bool *)((long)&null_ptr + 2),&stack0xffffffffffffffd8);
    lhs_local._0_1_ = pVar1.first;
  }
  else if (rhs == (char *)0x0) {
    null_ptr._1_1_ = 1;
    pVar1 = std::make_pair<bool,char_const*&>((bool *)((long)&null_ptr + 1),&rhs_local);
    lhs_local._0_1_ = pVar1.first;
  }
  else {
    if (t == BoolType) {
      __assert_fail("0 && \"consistentProperty for strings called with BoolType\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                    ,0x1293,
                    "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                   );
    }
    if (t == StringType) {
      pVar1 = consistentStringProperty(lhs,rhs);
      lhs_local._0_1_ = pVar1.first;
    }
    else {
      if (1 < t - NumberMinType) {
        __assert_fail("0 && \"Unreachable!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                      ,0x129b,
                      "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                     );
      }
      pVar1 = consistentNumberProperty(lhs,rhs,t);
      lhs_local._0_1_ = pVar1.first;
    }
  }
  local_10 = pVar1.second;
  pVar1.first = (bool)lhs_local._0_1_;
  pVar1.second = local_10;
  return pVar1;
}

Assistant:

std::pair<bool, const char*> consistentProperty(const char *lhs,
                                                const char *rhs,
                                                CompatibleType t)
{
  if (!lhs && !rhs)
    {
    return std::make_pair(true, lhs);
    }
  if (!lhs)
    {
    return std::make_pair(true, rhs);
    }
  if (!rhs)
    {
    return std::make_pair(true, lhs);
    }

  const char* const null_ptr = 0;

  switch(t)
  {
  case BoolType:
    assert(0 && "consistentProperty for strings called with BoolType");
    return std::pair<bool, const char*>(false, null_ptr);
  case StringType:
    return consistentStringProperty(lhs, rhs);
  case NumberMinType:
  case NumberMaxType:
    return consistentNumberProperty(lhs, rhs, t);
  }
  assert(0 && "Unreachable!");
  return std::pair<bool, const char*>(false, null_ptr);
}